

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void new_localvar(LexState *ls,TString *name,ravi_type_map tm,TString *usertype)

{
  short sVar1;
  int iVar2;
  int iVar3;
  FuncState *fs;
  Dyndata *pDVar4;
  Proto *o;
  LocVar *pLVar5;
  long lVar6;
  Vardesc *pVVar7;
  ravi_type_map *prVar8;
  char *__assertion;
  
  fs = ls->fs;
  pDVar4 = ls->dyd;
  o = fs->f;
  iVar2 = o->sizelocvars;
  if (iVar2 <= fs->nlocvars) {
    pLVar5 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x20,0x7fff,"local variables")
    ;
    o->locvars = pLVar5;
  }
  iVar3 = o->sizelocvars;
  if (iVar2 < iVar3) {
    lVar6 = (long)iVar3 - (long)iVar2;
    prVar8 = &o->locvars[iVar2].ravi_type_map;
    do {
      *(undefined8 *)(prVar8 + -2) = 0xffffffffffffffff;
      *prVar8 = 0xffffffff;
      ((LocVar *)(prVar8 + -6))->varname = (TString *)0x0;
      *(TString **)(prVar8 + -4) = (TString *)0x0;
      prVar8 = prVar8 + 8;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  pLVar5 = o->locvars;
  sVar1 = fs->nlocvars;
  pLVar5[sVar1].varname = name;
  pLVar5[sVar1].ravi_type_map = tm;
  pLVar5[sVar1].usertype = usertype;
  if (((o->marked & 0x20) != 0) && ((name->marked & 0x18) != 0)) {
    if ((o->tt & 0xe) < 10) {
      if ((name->tt & 0xe) < 10) {
        luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)name);
        goto LAB_0011f0cf;
      }
      __assertion = "(((varname)->tt) & 0x0F) < (9+1)";
    }
    else {
      __assertion = "(((f)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x19e,"int registerlocalvar(LexState *, TString *, ravi_type_map, TString *)");
  }
LAB_0011f0cf:
  sVar1 = fs->nlocvars;
  fs->nlocvars = sVar1 + 1;
  iVar2 = (pDVar4->actvar).n;
  if (0x7d < (iVar2 + 1) - fs->firstlocal) {
    errorlimit(fs,0x7d,"local variables");
  }
  if ((pDVar4->actvar).size < iVar2 + 2) {
    pVVar7 = (Vardesc *)
             luaM_growaux_(ls->L,(pDVar4->actvar).arr,&(pDVar4->actvar).size,2,0x7fffffff,
                           "local variables");
    (pDVar4->actvar).arr = pVVar7;
  }
  (pDVar4->actvar).arr[(pDVar4->actvar).n].idx = sVar1;
  if (((byte)ravi_parser_debug & 4) != 0) {
    raviY_printf(fs,"new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n"
                 ,fs->f->locvars + sVar1,(ulong)(uint)(int)sVar1);
  }
  (pDVar4->actvar).n = (pDVar4->actvar).n + 1;
  if (((byte)ravi_parser_debug & 4) == 0) {
    return;
  }
  raviY_printf(fs,"new_localvar -> ls->dyd->actvar.n set to %d\n");
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, ravi_type_map tm, TString *usertype) {
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  /* register variable and get its index */
  /* RAVI change - record type info for local variable */
  int reg = registerlocalvar(ls, name, tm, usertype);
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                  MAXVARS, "local variables");
  luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, MAX_INT, "local variables");
  /* variable will be placed at stack position dyd->actvar.n */
  dyd->actvar.arr[dyd->actvar.n].idx = cast(short, reg);
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n", &fs->f->locvars[reg], reg, dyd->actvar.n));
  dyd->actvar.n++;
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> ls->dyd->actvar.n set to %d\n", dyd->actvar.n));
}